

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::UpdateOutputToSourceMap
          (cmLocalGenerator *this,string *byproduct,cmTarget *target,cmListFileBacktrace *bt,
          cmCommandOrigin origin)

{
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>,_bool>
  pVar1;
  
  pVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>,std::allocator<std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,cmLocalGenerator::SourceEntry&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>,std::allocator<std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->OutputToSource);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(long *)((long)pVar1.first.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                 + 0x28) == 0) {
      *(cmTarget **)
       ((long)pVar1.first.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
       + 0x28) = target;
    }
  }
  else {
    anon_unknown.dwarf_14dc53d::CreateGeneratedSource(this,byproduct,Byproduct,origin,bt);
  }
  return;
}

Assistant:

void cmLocalGenerator::UpdateOutputToSourceMap(std::string const& byproduct,
                                               cmTarget* target,
                                               cmListFileBacktrace const& bt,
                                               cmCommandOrigin origin)
{
  SourceEntry entry;
  entry.Sources.Target = target;

  auto pr = this->OutputToSource.emplace(byproduct, entry);
  if (pr.second) {
    CreateGeneratedSource(*this, byproduct, OutputRole::Byproduct, origin, bt);
  } else {
    SourceEntry& current = pr.first->second;
    // Has the target already been set?
    if (!current.Sources.Target) {
      current.Sources.Target = target;
    } else {
      // Multiple custom commands/targets produce the same output (source file
      // or target).  See also comment in other UpdateOutputToSourceMap
      // overload.
      //
      // TODO: Warn the user about this case.
    }
  }
}